

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::ends_with(string *value,string *ending)

{
  int iVar1;
  string *psVar2;
  string *psVar3;
  undefined1 local_29;
  size_type vsize;
  size_type esize;
  string *ending_local;
  string *value_local;
  
  psVar2 = (string *)std::__cxx11::string::size();
  psVar3 = (string *)std::__cxx11::string::size();
  if (psVar2 < psVar3) {
    iVar1 = std::__cxx11::string::compare((ulong)value,(long)psVar3 - (long)psVar2,psVar2);
    local_29 = iVar1 == 0;
  }
  else {
    local_29 = false;
  }
  return local_29;
}

Assistant:

static inline bool
    ends_with(std::string const& value, std::string const& ending)
{
    auto esize = ending.size();
    auto vsize = value.size();
    return (vsize > esize) ?
        (value.compare(vsize - esize, esize, ending) == 0) :
        false;
}